

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pocketsphinx.c
# Opt level: O2

char * ps_current_search(ps_decoder_t *ps)

{
  hash_iter_t *itor;
  
  itor = hash_table_iter(ps->searches);
  while( true ) {
    if (itor == (hash_iter_t *)0x0) {
      return (char *)0x0;
    }
    if ((ps_search_t *)itor->ent->val == ps->search) break;
    itor = hash_table_iter_next(itor);
  }
  return itor->ent->key;
}

Assistant:

const char*
ps_current_search(ps_decoder_t *ps)
{
    hash_iter_t *search_it;
    const char* name = NULL;
    for (search_it = hash_table_iter(ps->searches); search_it;
        search_it = hash_table_iter_next(search_it)) {
        if (hash_entry_val(search_it->ent) == ps->search) {
            name = hash_entry_key(search_it->ent);
            break;
        }
    }
    return name;
}